

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.cc
# Opt level: O2

bool __thiscall prometheus::detail::CKMSQuantiles::insertBatch(CKMSQuantiles *this)

{
  pointer pIVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  int local_48 [2];
  double v;
  size_t local_38;
  
  local_38 = this->buffer_count_;
  if (local_38 != 0) {
    std::__sort<double*,__gnu_cxx::__ops::_Iter_less_iter>
              (&this->buffer_,(this->buffer_)._M_elems + local_38);
    bVar9 = (this->sample_).
            super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->sample_).
            super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar9) {
      v = (double)CONCAT44(v._4_4_,1);
      local_48[0] = 0;
      std::
      vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
      ::emplace_back<double&,int,int>
                ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                  *)&this->sample_,(this->buffer_)._M_elems,(int *)&v,local_48);
      this->count_ = this->count_ + 1;
    }
    uVar8 = 1;
    uVar6 = 0;
    for (uVar7 = (ulong)bVar9; uVar7 < this->buffer_count_; uVar7 = uVar7 + 1) {
      v = (this->buffer_)._M_elems[uVar7];
      pIVar1 = (this->sample_).
               super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(this->sample_).
                    super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4;
      uVar4 = uVar2;
      if (uVar2 < uVar8) {
        uVar4 = uVar8;
      }
      while ((uVar5 = uVar4, uVar4 != uVar8 && (uVar5 = uVar8, pIVar1[uVar6].value < v))) {
        uVar6 = uVar8;
        uVar8 = uVar8 + 1;
      }
      uVar6 = uVar5 - (v < pIVar1[uVar6].value);
      iVar3 = 0;
      if (uVar6 == 1) {
        uVar8 = 2;
        iVar3 = 0;
      }
      else {
        uVar8 = uVar6 + 1;
        if (uVar8 != uVar2) {
          dVar10 = allowableError(this,(int)uVar8);
          dVar10 = floor(dVar10);
          iVar3 = (int)dVar10 + 1;
        }
      }
      local_48[1] = 1;
      local_48[0] = iVar3;
      std::
      vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
      ::_M_emplace_aux<double&,int,int&>
                ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                  *)&this->sample_,pIVar1 + uVar6,&v,local_48 + 1,local_48);
      this->count_ = this->count_ + 1;
    }
    this->buffer_count_ = 0;
  }
  return local_38 != 0;
}

Assistant:

bool CKMSQuantiles::insertBatch() {
  if (buffer_count_ == 0) {
    return false;
  }

  std::sort(buffer_.begin(), buffer_.begin() + buffer_count_);

  std::size_t start = 0;
  if (sample_.empty()) {
    sample_.emplace_back(buffer_[0], 1, 0);
    ++start;
    ++count_;
  }

  std::size_t idx = 0;
  std::size_t item = idx++;

  for (std::size_t i = start; i < buffer_count_; ++i) {
    double v = buffer_[i];
    while (idx < sample_.size() && sample_[item].value < v) {
      item = idx++;
    }

    if (sample_[item].value > v) {
      --idx;
    }

    int delta;
    if (idx - 1 == 0 || idx + 1 == sample_.size()) {
      delta = 0;
    } else {
      delta = static_cast<int>(std::floor(allowableError(idx + 1))) + 1;
    }

    sample_.emplace(sample_.begin() + idx, v, 1, delta);
    count_++;
    item = idx++;
  }

  buffer_count_ = 0;
  return true;
}